

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall
chatra::RuntimeImp::restoreNode(RuntimeImp *this,Reader *r,PackageId packageId,Node *node)

{
  Package *errorReceiver;
  undefined8 *puVar1;
  undefined **local_70;
  IErrorReceiverBridge errorReceiverBridge;
  shared_ptr<chatra::Node> n;
  
  if ((node->blockNodesState)._M_i != Parsed) {
    errorReceiverBridge.super_IErrorReceiver._vptr_IErrorReceiver =
         (_func_int **)&this->super_IErrorReceiver;
    local_70 = &PTR__IErrorReceiver_0023d238;
    errorReceiverBridge.target._0_4_ = 0;
    errorReceiver = IdPool<chatra::PackageId,_chatra::Package>::ref(&this->packageIds,packageId);
    Package::parseNode((Package *)&errorReceiverBridge.errorCount,(IErrorReceiver *)errorReceiver,
                       (Node *)&local_70,SUB81(node,0));
    std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)
               &errorReceiverBridge.errorCount);
    if ((int)errorReceiverBridge.target != 0) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = &PTR__exception_0023d4d0;
      __cxa_throw(puVar1,&AbortCompilingException::typeinfo,std::exception::~exception);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&n);
    restoreEntities(this,r,packageId,node);
  }
  return;
}

Assistant:

void RuntimeImp::restoreNode(Reader& r, PackageId packageId, Node* node) {
	if (node->blockNodesState == NodeState::Parsed)
		return;

	IErrorReceiverBridge errorReceiverBridge(*this);
	try {
		auto n = packageIds.ref(packageId)->parseNode(errorReceiverBridge, node);
		n.reset();
		if (errorReceiverBridge.hasError())
			throw AbortCompilingException();
	}
	catch (AbortCompilingException&) {
		errorAtNode(*this, ErrorLevel::Error, node, "an unrecoverable parser error encountered during restoration", {});
		throw IllegalArgumentException();
	}

	restoreEntities(r, packageId, node);
}